

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O0

bool __thiscall
QNativeSocketEnginePrivate::createNewSocket
          (QNativeSocketEnginePrivate *this,SocketType socketType,
          NetworkLayerProtocol *socketProtocol)

{
  SocketError error;
  undefined4 uVar1;
  int iVar2;
  int *piVar3;
  SocketError *pSVar4;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  int ecopy;
  int socket;
  int type;
  int domain;
  int protocol;
  int in_stack_ffffffffffffffb8;
  undefined3 in_stack_ffffffffffffffbc;
  int protocol_00;
  ErrorString in_stack_ffffffffffffffc8;
  SocketError in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  if (in_ESI == 2) {
    setError((QNativeSocketEnginePrivate *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc
             ,in_stack_ffffffffffffffc8);
    return false;
  }
  protocol_00 = CONCAT13(1,in_stack_ffffffffffffffbc);
  if (*in_RDX != 1) {
    protocol_00 = CONCAT13(*in_RDX == 2,in_stack_ffffffffffffffbc);
  }
  uVar1 = 1;
  if (in_ESI == 1) {
    uVar1 = 2;
  }
  iVar2 = qt_safe_socket((int)((ulong)in_RDI >> 0x20),(int)in_RDI,protocol_00,
                         in_stack_ffffffffffffffb8);
  if (((iVar2 < 0) && (*in_RDX == 2)) && (piVar3 = __errno_location(), *piVar3 == 0x61)) {
    iVar2 = qt_safe_socket((int)((ulong)in_RDI >> 0x20),(int)in_RDI,protocol_00,
                           in_stack_ffffffffffffffb8);
    *in_RDX = 0;
  }
  if (-1 < iVar2) {
    *(long *)(in_RDI + 0xd8) = (long)iVar2;
    *(int *)(in_RDI + 0xa0) = *in_RDX;
    *(int *)(in_RDI + 0x9c) = in_ESI;
    return true;
  }
  pSVar4 = __errno_location();
  error = *pSVar4;
  if (error != ProxyAuthenticationRequiredError) {
    if (error == SslHandshakeFailedError) {
      setError((QNativeSocketEnginePrivate *)CONCAT44(uVar1,iVar2),SslHandshakeFailedError,
               in_stack_ffffffffffffffc8);
      return false;
    }
    if (error == TemporaryError) {
LAB_00359db1:
      setError((QNativeSocketEnginePrivate *)CONCAT44(uVar1,iVar2),error,in_stack_ffffffffffffffc8);
      return false;
    }
    if (1 < (uint)(error + ~TemporaryError)) {
      if ((error == 0x5d) || (error == 0x61)) goto LAB_00359db1;
      if (error != 0x69) {
        return false;
      }
    }
  }
  setError((QNativeSocketEnginePrivate *)CONCAT44(uVar1,iVar2),error,in_stack_ffffffffffffffc8);
  return false;
}

Assistant:

bool QNativeSocketEnginePrivate::createNewSocket(QAbstractSocket::SocketType socketType,
                                         QAbstractSocket::NetworkLayerProtocol &socketProtocol)
{
#ifndef QT_NO_SCTP
    int protocol = (socketType == QAbstractSocket::SctpSocket) ? IPPROTO_SCTP : 0;
#else
    if (socketType == QAbstractSocket::SctpSocket) {
        setError(QAbstractSocket::UnsupportedSocketOperationError,
                 ProtocolUnsupportedErrorString);
#if defined (QNATIVESOCKETENGINE_DEBUG)
        qDebug("QNativeSocketEnginePrivate::createNewSocket(%d, %d): unsupported protocol",
               socketType, socketProtocol);
#endif
        return false;
    }
    int protocol = 0;
#endif // QT_NO_SCTP
    int domain = (socketProtocol == QAbstractSocket::IPv6Protocol
                  || socketProtocol == QAbstractSocket::AnyIPProtocol) ? AF_INET6 : AF_INET;
    int type = (socketType == QAbstractSocket::UdpSocket) ? SOCK_DGRAM : SOCK_STREAM;

    int socket = qt_safe_socket(domain, type, protocol, O_NONBLOCK);
    if (socket < 0 && socketProtocol == QAbstractSocket::AnyIPProtocol && errno == EAFNOSUPPORT) {
        domain = AF_INET;
        socket = qt_safe_socket(domain, type, protocol, O_NONBLOCK);
        socketProtocol = QAbstractSocket::IPv4Protocol;
    }

    if (socket < 0) {
        int ecopy = errno;
        switch (ecopy) {
        case EPROTONOSUPPORT:
        case EAFNOSUPPORT:
        case EINVAL:
            setError(QAbstractSocket::UnsupportedSocketOperationError, ProtocolUnsupportedErrorString);
            break;
        case ENFILE:
        case EMFILE:
        case ENOBUFS:
        case ENOMEM:
            setError(QAbstractSocket::SocketResourceError, ResourceErrorString);
            break;
        case EACCES:
            setError(QAbstractSocket::SocketAccessError, AccessErrorString);
            break;
        default:
            break;
        }

#if defined (QNATIVESOCKETENGINE_DEBUG)
        qDebug("QNativeSocketEnginePrivate::createNewSocket(%d, %d) == false (%s)",
               socketType, socketProtocol,
               strerror(ecopy));
#endif

        return false;
    }

#if defined (QNATIVESOCKETENGINE_DEBUG)
    qDebug("QNativeSocketEnginePrivate::createNewSocket(%d, %d) == true",
           socketType, socketProtocol);
#endif

    socketDescriptor = socket;
    this->socketProtocol = socketProtocol;
    this->socketType = socketType;
    return true;
}